

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.cpp
# Opt level: O0

double variance(int *I_l,int n_int)

{
  int in_ESI;
  int *in_RDI;
  __type_conflict _Var1;
  int i;
  double l_var;
  double l_mean;
  int __y;
  double __x;
  
  sum(in_RDI,in_ESI);
  __x = 0.0;
  for (__y = 1; __y <= in_ESI; __y = __y + 1) {
    _Var1 = std::pow<double,int>(__x,__y);
    __x = _Var1 + __x;
  }
  return __x / (double)(in_ESI + -1);
}

Assistant:

double variance(int* I_l, int n_int)
{
    double l_mean = double(sum(I_l,n_int)) / n_int;
    double l_var = 0;

    for(int i=1; i<=n_int; i++)
    {
        l_var += pow(I_l[i]-l_mean, 2);
    }

    l_var /= n_int-1;
    return l_var;
}